

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

void ecs_log_print(int level,char *file,int32_t line,char *fmt,__va_list_tag *valist)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  ushort *puVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  ushort **ppuVar11;
  long lVar12;
  ulong uVar13;
  undefined4 in_register_00000014;
  char cVar14;
  ulong uVar15;
  char *str;
  ulong uVar16;
  bool bVar17;
  char cVar18;
  char indent [32];
  ecs_strbuf_t local_578;
  char filebuff [256];
  
  if (level <= trace_level) {
    strcpy(filebuff,file);
    pcVar9 = strrchr(filebuff,0x2f);
    pcVar10 = pcVar9 + 1;
    if (pcVar9 == (char *)0x0) {
      pcVar10 = filebuff;
    }
    pcVar10 = strrchr(pcVar10,0x2e);
    if (pcVar10 != (char *)0x0) {
      *pcVar10 = '\0';
    }
    uVar13 = 0;
    uVar15 = (ulong)(uint)trace_indent;
    if (trace_indent < 1) {
      uVar15 = uVar13;
    }
    for (; uVar15 != uVar13; uVar13 = uVar13 + 1) {
      (indent + uVar13 * 2)[0] = '|';
      (indent + uVar13 * 2)[1] = ' ';
    }
    indent[uVar15 * 2] = '\0';
    pcVar9 = ecs_vasprintf((char *)CONCAT44(in_register_00000014,line),(__va_list_tag *)fmt);
    uVar13 = 0;
    memset(&local_578,0,0x440);
    bVar7 = true;
    bVar5 = false;
    uVar15 = 0;
    bVar6 = false;
    bVar17 = false;
    pcVar10 = pcVar9;
    while( true ) {
      cVar2 = *pcVar10;
      uVar16 = (ulong)cVar2;
      cVar14 = (char)uVar15;
      if (uVar16 == 0) break;
      if (!bVar17) {
        if (((bVar5) && (ppuVar11 = __ctype_b_loc(), ((*ppuVar11)[uVar16] & 0xc00) == 0)) &&
           ((cVar2 != '%' && (cVar2 != '.')))) {
          ecs_strbuf_appendstr(&local_578,"\x1b[0;49m");
          bVar5 = false;
        }
        cVar18 = (char)uVar13;
        lVar12 = (long)cVar18;
        if (((cVar14 == '\0') || (cVar18 == '\\')) || (cVar14 != cVar2)) {
          if ((cVar2 == '\'' || cVar2 == '\"') && (cVar14 == '\0')) {
            ppuVar11 = __ctype_b_loc();
            uVar15 = 0;
            if ((cVar18 != '\\') && (((*ppuVar11)[lVar12] & 0x400) == 0)) {
              ecs_strbuf_appendstr(&local_578,"\x1b[0;36m");
              uVar15 = uVar16 & 0xffffffff;
            }
          }
        }
        else {
          uVar15 = 0;
        }
        ppuVar11 = __ctype_b_loc();
        puVar4 = *ppuVar11;
        if ((*(byte *)((long)puVar4 + uVar16 * 2 + 1) & 8) == 0) {
          if (cVar2 == '-') {
            bVar3 = *(byte *)((long)puVar4 + (long)pcVar10[1] * 2 + 1);
joined_r0x00114ecf:
            if ((bVar3 & 8) != 0) goto joined_r0x00114e7e;
          }
          else if (cVar2 == '%') {
            bVar3 = *(byte *)((long)puVar4 + lVar12 * 2 + 1);
            goto joined_r0x00114ecf;
          }
        }
        else {
joined_r0x00114e7e:
          if ((((!bVar5) && ((char)uVar15 == '\0')) && (!bVar6)) &&
             ((((puVar4[lVar12] & 0xc00) == 0 && (cVar18 != '.')) && (((uint)uVar13 & 0xff) != 0x5f)
              ))) {
            ecs_strbuf_appendstr(&local_578,"\x1b[0;32m");
            bVar5 = true;
          }
        }
        if (((bVar6) && (((*ppuVar11)[uVar16] >> 10 & 1) == 0)) &&
           ((cVar2 != '_' && (((*ppuVar11)[uVar16] & 0x800) == 0)))) {
          ecs_strbuf_appendstr(&local_578,"\x1b[0;49m");
          bVar6 = false;
        }
        if ((((char)uVar15 == '\0') && (uVar15 = 0, cVar2 == '$')) && (!bVar6)) {
          if ((*(byte *)((long)*ppuVar11 + (long)pcVar10[1] * 2 + 1) & 4) != 0) {
            ecs_strbuf_appendstr(&local_578,"\x1b[0;36m");
            bVar6 = true;
          }
          uVar15 = 0;
        }
      }
      if (((bVar6) || ((char)uVar15 != '\0')) || ((cVar2 != '#' || (bVar5)))) {
        if (cVar2 == '\n') {
          if (((!bVar5) && ((char)uVar15 == '\0')) && ((!bVar6 && (!bVar17)))) goto LAB_00114fff;
          ecs_strbuf_appendstr(&local_578,"\x1b[0;49m");
          bVar17 = false;
          bVar6 = false;
          uVar15 = 0;
          bVar5 = false;
        }
LAB_0011516a:
        ecs_strbuf_appendstrn(&local_578,pcVar10,1);
      }
      else {
        if (pcVar10[1] != '[') {
LAB_00114fff:
          uVar15 = 0;
          goto LAB_0011516a;
        }
        if (pcVar10[2] == ']') {
          bVar17 = true;
          bVar7 = false;
        }
        else {
          pcVar1 = pcVar10 + 2;
          iVar8 = strncmp(pcVar1,"green]",6);
          bVar17 = true;
          if (iVar8 == 0) {
            str = "\x1b[0;32m";
          }
          else {
            iVar8 = strncmp(pcVar1,"red]",4);
            if (iVar8 == 0) {
              str = "\x1b[0;31m";
            }
            else {
              iVar8 = strncmp(pcVar1,"blue]",4);
              if (iVar8 == 0) {
                str = "\x1b[0;34m";
              }
              else {
                iVar8 = strncmp(pcVar1,"magenta]",8);
                if (iVar8 == 0) {
                  str = "\x1b[0;35m";
                }
                else {
                  iVar8 = strncmp(pcVar1,"cyan]",5);
                  if (iVar8 == 0) {
                    str = "\x1b[0;36m";
                  }
                  else {
                    iVar8 = strncmp(pcVar1,"yellow]",7);
                    if (iVar8 == 0) {
                      str = "\x1b[0;33m";
                    }
                    else {
                      iVar8 = strncmp(pcVar1,"grey]",5);
                      if (iVar8 == 0) {
                        str = "\x1b[0;37m";
                      }
                      else {
                        iVar8 = strncmp(pcVar1,"white]",6);
                        if (iVar8 == 0) {
LAB_001151c7:
                          str = "\x1b[0;49m";
                        }
                        else {
                          iVar8 = strncmp(pcVar1,"bold]",5);
                          if (iVar8 == 0) {
                            str = "\x1b[1;49m";
                          }
                          else {
                            iVar8 = strncmp(pcVar1,"normal]",7);
                            str = "\x1b[0;49m";
                            if (iVar8 != 0) {
                              iVar8 = strncmp(pcVar1,"reset]",6);
                              if (iVar8 != 0) {
                                bVar17 = (bool)(bVar7 ^ 1);
                                goto LAB_00114fff;
                              }
                              bVar17 = false;
                              goto LAB_001151c7;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          ecs_strbuf_appendstr(&local_578,str);
        }
        pcVar10 = pcVar10 + 1;
        do {
          pcVar1 = pcVar10 + 1;
          pcVar10 = pcVar10 + 1;
        } while (*pcVar1 != ']');
        if (!bVar7) {
          bVar17 = true;
        }
        uVar16 = 0x5d;
        uVar15 = 0;
      }
      if ((!bVar17) && ((char)uVar15 == '\0' && ((char)uVar16 == '\"' || (char)uVar16 == '\''))) {
        ecs_strbuf_appendstr(&local_578,"\x1b[0;49m");
      }
      pcVar10 = pcVar10 + 1;
      uVar13 = uVar16 & 0xffffffff;
    }
    if ((((bVar5) || (cVar14 != '\0')) || (bVar6)) || (bVar17)) {
      ecs_strbuf_appendstr(&local_578,"\x1b[0;49m");
    }
    pcVar10 = ecs_strbuf_get(&local_578);
    if (level < 0) {
      if (level != -1) {
        if (level == -2) {
          ecs_os_warn("%swarn%s: %s%s%s%s","\x1b[0;33m","\x1b[0;49m","\x1b[0;37m",indent,
                      "\x1b[0;49m",pcVar10);
        }
        else {
          ecs_os_err("%serr %s: %s%s%s%s","\x1b[0;31m","\x1b[0;49m","\x1b[0;37m",indent,"\x1b[0;49m"
                     ,pcVar10);
        }
      }
    }
    else {
      ecs_os_log("%sinfo%s: %s%s%s%s","\x1b[0;35m","\x1b[0;49m","\x1b[0;37m",indent,"\x1b[0;49m",
                 pcVar10);
    }
    (*ecs_os_api.free_)(pcVar10);
    (*ecs_os_api.free_)(pcVar9);
  }
  return;
}

Assistant:

static
void ecs_log_print(
    int level,
    const char *file,
    int32_t line,
    const char *fmt,
    va_list valist)
{
    (void)level;
    (void)line;

    if (level > trace_level) {
        return;
    }

    /* Massage filename so it doesn't take up too much space */
    char filebuff[256];
    ecs_os_strcpy(filebuff, file);
    file = filebuff;
    char *file_ptr = strrchr(file, '/');
    if (file_ptr) {
        file = file_ptr + 1;
    }

    /* Extension is likely the same for all files */
    file_ptr = strrchr(file, '.');
    if (file_ptr) {
        *file_ptr = '\0';
    }

    char indent[32];
    int i;
    for (i = 0; i < trace_indent; i ++) {
        indent[i * 2] = '|';
        indent[i * 2 + 1] = ' ';
    }
    indent[i * 2] = '\0';

    char *msg = ecs_vasprintf(fmt, valist);
    char *color_msg = ecs_colorize(msg);

    if (level >= 0) {
        ecs_os_log("%sinfo%s: %s%s%s%s",
            ECS_MAGENTA, ECS_NORMAL, ECS_GREY, indent, ECS_NORMAL, color_msg);
    } else if (level == -2) {
        ecs_os_warn("%swarn%s: %s%s%s%s",
            ECS_YELLOW, ECS_NORMAL, ECS_GREY, indent, ECS_NORMAL, color_msg);
    } else if (level <= -2) {
        ecs_os_err("%serr %s: %s%s%s%s",
            ECS_RED, ECS_NORMAL, ECS_GREY, indent, ECS_NORMAL, color_msg);
    }

    ecs_os_free(color_msg);
    ecs_os_free(msg);
}